

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Header.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Minefield_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Header *this)

{
  ostream *poVar1;
  ulong uVar2;
  ushort uVar3;
  KStringStream ss;
  char local_379;
  KString local_378;
  long *local_358;
  long local_350;
  long local_348 [2];
  stringstream local_338 [16];
  ostream local_328 [112];
  ios_base local_2b8 [264];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_338);
  std::__ostream_insert<char,std::char_traits<char>>(local_328,"Minefield ID:\n",0xe);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_378,&this->m_MinefieldID);
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_379 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_379,1);
  if (local_378._M_string_length != 0) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      local_379 = local_378._M_dataplus._M_p[uVar2];
      if ((local_378._M_string_length - 1 == uVar2) || (local_379 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_379,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_379,1);
        local_379 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_379,1);
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < local_378._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_328,(char *)local_358,local_350)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base(local_2b8);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Minefield ID:\n"
       << IndentString( m_MinefieldID.GetAsString(), 1 )
       << "\n";

    return ss.str();
}